

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonehash.cpp
# Opt level: O3

void __thiscall
asmjit::v1_14::ZoneHashBase::_rehash
          (ZoneHashBase *this,ZoneAllocator *allocator,uint32_t primeIndex)

{
  ZoneHashBase ZVar1;
  uint uVar2;
  uint uVar3;
  ZoneHashBase *p;
  undefined8 *puVar4;
  long lVar5;
  undefined8 *puVar6;
  void *pvVar7;
  ulong uVar8;
  uint uVar9;
  undefined8 *extraout_RDX;
  ZoneAllocator *allocator_00;
  ZoneHashBase *this_00;
  size_t sStack_38;
  
  if (primeIndex < 0x81) {
    allocator_00 = allocator;
    this_00 = this;
    if (*(long *)allocator == 0) goto LAB_0012ad3b;
    uVar8 = (ulong)primeIndex;
    uVar9 = *(uint *)(ZoneHash_primeArray + uVar8 * 8);
    p = *(ZoneHashBase **)this;
    allocator_00 = (ZoneAllocator *)((ulong)uVar9 * 8);
    pvVar7 = ZoneAllocator::_allocZeroed(allocator,(size_t)allocator_00,&sStack_38);
    if (pvVar7 == (void *)0x0) {
      return;
    }
    uVar2 = *(uint *)(this + 0x10);
    this_00 = (ZoneHashBase *)(ulong)uVar2;
    *(void **)this = pvVar7;
    *(uint *)(this + 0x10) = uVar9;
    *(int *)(this + 0x14) = (int)(long)((double)uVar9 * 0.9);
    uVar3 = *(uint *)(ZoneHash_primeArray + uVar8 * 8 + 4);
    *(uint *)(this + 0x18) = uVar3;
    ZVar1 = *(ZoneHashBase *)(ZoneHash_primeShift + uVar8);
    this[0x1c] = ZVar1;
    this[0x1d] = SUB41(primeIndex,0);
    if (this_00 != (ZoneHashBase *)0x0) {
      allocator_00 = (ZoneAllocator *)0x0;
      do {
        puVar6 = *(undefined8 **)(p + (long)allocator_00 * 8);
        while (puVar6 != (undefined8 *)0x0) {
          puVar4 = (undefined8 *)*puVar6;
          uVar8 = (ulong)(*(uint *)(puVar6 + 1) -
                         (int)((ulong)*(uint *)(puVar6 + 1) * (ulong)uVar3 >> ((byte)ZVar1 & 0x3f))
                         * uVar9);
          *puVar6 = *(undefined8 *)((long)pvVar7 + uVar8 * 8);
          *(undefined8 **)((long)pvVar7 + uVar8 * 8) = puVar6;
          puVar6 = puVar4;
        }
        allocator_00 = allocator_00 + 1;
      } while (allocator_00 != (ZoneAllocator *)this_00);
    }
    if (p == this + 0x20) {
      return;
    }
    if (*(long *)allocator == 0) goto LAB_0012ad40;
    if (p != (ZoneHashBase *)0x0) {
      if (this_00 != (ZoneHashBase *)0x0) {
        if (0x40 < uVar2) {
          ZoneAllocator::_releaseDynamic(allocator,p,(long)this_00 * 8);
          return;
        }
        _rehash();
        return;
      }
      goto LAB_0012ad4a;
    }
  }
  else {
    _rehash();
    allocator_00 = allocator;
    this_00 = this;
LAB_0012ad3b:
    _rehash();
LAB_0012ad40:
    _rehash();
  }
  _rehash();
LAB_0012ad4a:
  _rehash();
  uVar8 = (ulong)(*(uint *)(extraout_RDX + 1) -
                 (int)((ulong)*(uint *)(this_00 + 0x18) * (ulong)*(uint *)(extraout_RDX + 1) >>
                      ((byte)this_00[0x1c] & 0x3f)) * *(int *)(this_00 + 0x10));
  lVar5 = *(long *)this_00;
  *extraout_RDX = *(undefined8 *)(lVar5 + uVar8 * 8);
  *(undefined8 **)(lVar5 + uVar8 * 8) = extraout_RDX;
  lVar5 = *(long *)(this_00 + 8);
  *(ulong *)(this_00 + 8) = lVar5 + 1U;
  if ((ulong)*(uint *)(this_00 + 0x14) < lVar5 + 1U) {
    ZVar1 = this_00[0x1d];
    uVar9 = 0x7e;
    if ((byte)ZVar1 < 0x7e) {
      uVar9 = (uint)(byte)ZVar1;
    }
    if ((uint)(byte)ZVar1 < uVar9 + 2) {
      _rehash(this_00,allocator_00,uVar9 + 2);
    }
  }
  return;
}

Assistant:

void ZoneHashBase::_rehash(ZoneAllocator* allocator, uint32_t primeIndex) noexcept {
  ASMJIT_ASSERT(primeIndex < ASMJIT_ARRAY_SIZE(ZoneHash_primeArray));
  uint32_t newCount = ZoneHash_primeArray[primeIndex].prime;

  ZoneHashNode** oldData = _data;
  ZoneHashNode** newData = reinterpret_cast<ZoneHashNode**>(
    allocator->allocZeroed(size_t(newCount) * sizeof(ZoneHashNode*)));

  // We can still store nodes into the table, but it will degrade.
  if (ASMJIT_UNLIKELY(newData == nullptr))
    return;

  uint32_t i;
  uint32_t oldCount = _bucketsCount;

  _data = newData;
  _bucketsCount = newCount;
  _bucketsGrow = uint32_t(newCount * 0.9);
  _rcpValue = ZoneHash_primeArray[primeIndex].rcp;
  _rcpShift = ZoneHash_primeShift[primeIndex];
  _primeIndex = uint8_t(primeIndex);

  for (i = 0; i < oldCount; i++) {
    ZoneHashNode* node = oldData[i];
    while (node) {
      ZoneHashNode* next = node->_hashNext;
      uint32_t hashMod = _calcMod(node->_hashCode);

      node->_hashNext = newData[hashMod];
      newData[hashMod] = node;
      node = next;
    }
  }

  if (oldData != _embedded)
    allocator->release(oldData, oldCount * sizeof(ZoneHashNode*));
}